

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::Cond<float>::doApply
          (IRet *__return_storage_ptr__,Cond<float> *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *pIVar1;
  bool bVar2;
  IVal local_80;
  Interval local_68;
  IVal local_50;
  Interval local_38;
  IArgs *local_20;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  Cond<float> *this_local;
  
  local_20 = iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  tcu::Interval::Interval(__return_storage_ptr__);
  pIVar1 = local_20->a;
  tcu::Interval::Interval(&local_38,1.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_38);
  if (bVar2) {
    unionIVal<float>(&local_50,__return_storage_ptr__,local_20->b);
    __return_storage_ptr__->m_hasNaN = local_50.m_hasNaN;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_50._1_7_;
    __return_storage_ptr__->m_lo = local_50.m_lo;
    __return_storage_ptr__->m_hi = local_50.m_hi;
  }
  pIVar1 = local_20->a;
  tcu::Interval::Interval(&local_68,0.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_68);
  if (bVar2) {
    unionIVal<float>(&local_80,__return_storage_ptr__,local_20->c);
    __return_storage_ptr__->m_hasNaN = local_80.m_hasNaN;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_80._1_7_;
    __return_storage_ptr__->m_lo = local_80.m_lo;
    __return_storage_ptr__->m_hi = local_80.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}